

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_send_http_redirect(mg_connection *conn,char *target_url,int redirect_code)

{
  int iVar1;
  int status;
  
  status = 0x133;
  if (redirect_code != 0) {
    status = redirect_code;
  }
  iVar1 = -2;
  if ((status - 0x12dU < 8) && ((199U >> (status - 0x12dU & 0x1f) & 1) != 0)) {
    if ((target_url == (char *)0x0) || (*target_url == '\0')) {
      target_url = "/";
    }
    mg_response_header_start(conn,status);
    mg_response_header_add(conn,"Location",target_url,-1);
    send_no_cache_header(conn);
    send_additional_header(conn);
    send_cors_header(conn);
    iVar1 = 1;
    mg_response_header_add(conn,"Content-Length","0",1);
    mg_response_header_send(conn);
  }
  return iVar1;
}

Assistant:

CIVETWEB_API int
mg_send_http_redirect(struct mg_connection *conn,
                      const char *target_url,
                      int redirect_code)
{
	/* Send a 30x redirect response.
	 *
	 * Redirect types (status codes):
	 *
	 * Status | Perm/Temp | Method              | Version
	 *   301  | permanent | POST->GET undefined | HTTP/1.0
	 *   302  | temporary | POST->GET undefined | HTTP/1.0
	 *   303  | temporary | always use GET      | HTTP/1.1
	 *   307  | temporary | always keep method  | HTTP/1.1
	 *   308  | permanent | always keep method  | HTTP/1.1
	 */

#if defined(MG_SEND_REDIRECT_BODY)
	char redirect_body[MG_BUF_LEN];
	size_t content_len = 0;
	char content_len_text[32];
#endif

	/* In case redirect_code=0, use 307. */
	if (redirect_code == 0) {
		redirect_code = 307;
	}

	/* In case redirect_code is none of the above, return error. */
	if ((redirect_code != 301) && (redirect_code != 302)
	    && (redirect_code != 303) && (redirect_code != 307)
	    && (redirect_code != 308)) {
		/* Parameter error */
		return -2;
	}

	/* If target_url is not defined, redirect to "/". */
	if ((target_url == NULL) || (*target_url == 0)) {
		target_url = "/";
	}

#if defined(MG_SEND_REDIRECT_BODY)
	/* TODO: condition name? */

	/* Prepare a response body with a hyperlink.
	 *
	 * According to RFC2616 (and RFC1945 before):
	 * Unless the request method was HEAD, the entity of the
	 * response SHOULD contain a short hypertext note with a hyperlink to
	 * the new URI(s).
	 *
	 * However, this response body is not useful in M2M communication.
	 * Probably the original reason in the RFC was, clients not supporting
	 * a 30x HTTP redirect could still show the HTML page and let the user
	 * press the link. Since current browsers support 30x HTTP, the additional
	 * HTML body does not seem to make sense anymore.
	 *
	 * The new RFC7231 (Section 6.4) does no longer recommend it ("SHOULD"),
	 * but it only notes:
	 * The server's response payload usually contains a short
	 * hypertext note with a hyperlink to the new URI(s).
	 *
	 * Deactivated by default. If you need the 30x body, set the define.
	 */
	mg_snprintf(
	    conn,
	    NULL /* ignore truncation */,
	    redirect_body,
	    sizeof(redirect_body),
	    "<html><head>%s</head><body><a href=\"%s\">%s</a></body></html>",
	    redirect_text,
	    target_url,
	    target_url);
	content_len = strlen(reply);
	sprintf(content_len_text, "%lu", (unsigned long)content_len);
#endif

	/* Send all required headers */
	mg_response_header_start(conn, redirect_code);
	mg_response_header_add(conn, "Location", target_url, -1);
	if ((redirect_code == 301) || (redirect_code == 308)) {
		/* Permanent redirect */
		send_static_cache_header(conn);
	} else {
		/* Temporary redirect */
		send_no_cache_header(conn);
	}
	send_additional_header(conn);
	send_cors_header(conn);
#if defined(MG_SEND_REDIRECT_BODY)
	mg_response_header_add(conn, "Content-Type", "text/html", -1);
	mg_response_header_add(conn, "Content-Length", content_len_text, -1);
#else
	mg_response_header_add(conn, "Content-Length", "0", 1);
#endif
	mg_response_header_send(conn);

#if defined(MG_SEND_REDIRECT_BODY)
	/* Send response body */
	/* ... unless it is a HEAD request */
	if (0 != strcmp(conn->request_info.request_method, "HEAD")) {
		ret = mg_write(conn, redirect_body, content_len);
	}
#endif

	return 1;
}